

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockNodeAddTabBar(ImGuiDockNode *node)

{
  ImGuiTabBar *this;
  ImGuiDockNode *node_local;
  
  if (node->TabBar == (ImGuiTabBar *)0x0) {
    MemAlloc(0x98);
    this = (ImGuiTabBar *)operator_new(0x98);
    ImGuiTabBar::ImGuiTabBar(this);
    node->TabBar = this;
    return;
  }
  __assert_fail("node->TabBar == __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                ,0x3c75,"void ImGui::DockNodeAddTabBar(ImGuiDockNode *)");
}

Assistant:

static void ImGui::DockNodeAddTabBar(ImGuiDockNode* node)
{
    IM_ASSERT(node->TabBar == NULL);
    node->TabBar = IM_NEW(ImGuiTabBar);
}